

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageLoader::load_resource_file(CVmImageLoader *this,CVmImageLoaderMres *res_ifc)

{
  bool bVar1;
  bool bVar2;
  char buf [128];
  int local_a8;
  uint local_a4;
  ushort local_a0;
  
  read_image_header(this);
  bVar2 = false;
  do {
    (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_a8,10);
    bVar1 = true;
    if (local_a8 != 0x20464f45) {
      bVar1 = bVar2;
      if (local_a8 == 0x5345524d) {
        load_mres(this,(ulong)local_a4,res_ifc);
      }
      else if (local_a8 == 0x4c45524d) {
        load_mres_link(this,(ulong)local_a4,res_ifc);
      }
      else {
        if ((local_a0 & 1) != 0) {
          err_throw_a(0x131,1,8);
        }
        (*this->fp_->_vptr_CVmImageFile[9])();
      }
    }
    bVar2 = bVar1;
  } while (!bVar1);
  return;
}

Assistant:

void CVmImageLoader::load_resource_file(CVmImageLoaderMres *res_ifc)
{
    int done;

    /* read and validate the image header */
    read_image_header();

    /* load the blocks */
    for (done = FALSE ; !done ; )
    {
        ulong siz;
        uint flags;
        char buf[128];

        /* read the next data block header */
        fp_->copy_data(buf, 10);

        /* get the size */
        siz = t3rp4u(buf + 4);

        /* get the flags */
        flags = osrp2(buf + 8);

        /* check the block type */
        if (block_type_is(buf, "EOF "))
        {
            /* we're done */
            done = TRUE;
        }
        else if (block_type_is(buf, "MRES"))
        {
            /* load the multimedia resource block */
            load_mres(siz, res_ifc);
        }
        else if (block_type_is(buf, "MREL"))
        {
            /* load the multimedia resource link block */
            load_mres_link(siz, res_ifc);
        }
        else
        {
            /* 
             *   Unknown block type - ignore it, unless it's mandatory, in
             *   which case this is an error.  This is a version-related
             *   error (fixable by updating to the latest version), so set
             *   the version flag in the exception, if we throw one.  
             */
            if ((flags & VMIMAGE_DBF_MANDATORY) != 0)
                err_throw_a(VMERR_UNKNOWN_IMAGE_BLOCK, 1,
                            ERR_TYPE_VERSION_FLAG);

            /* skip past the block */
            fp_->skip_ahead(siz);
        }
    }
}